

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

void __thiscall QAbstractScrollArea::QAbstractScrollArea(QAbstractScrollArea *this,QWidget *parent)

{
  QAbstractScrollAreaPrivate *this_00;
  
  this_00 = (QAbstractScrollAreaPrivate *)operator_new(0x2f8);
  QAbstractScrollAreaPrivate::QAbstractScrollAreaPrivate(this_00);
  QFrame::QFrame((QFrame *)this,(QFramePrivate *)this_00,parent,(WindowFlags)0x0);
  *(undefined ***)this = &PTR_metaObject_007c46f0;
  *(undefined ***)(this + 0x10) = &PTR__QAbstractScrollArea_007c48c8;
  QAbstractScrollAreaPrivate::init
            (*(QAbstractScrollAreaPrivate **)(this + 8),(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QAbstractScrollArea::QAbstractScrollArea(QWidget *parent)
    :QFrame(*new QAbstractScrollAreaPrivate, parent)
{
    Q_D(QAbstractScrollArea);
    QT_TRY {
        d->init();
    }